

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.cpp
# Opt level: O1

QString * __thiscall ProString::toQString(ProString *this,QString *tmp)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  undefined8 local_38;
  undefined8 uStack_30;
  qsizetype local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QString::mid((longlong)&local_38,(longlong)this);
  pQVar1 = &((tmp->d).d)->super_QArrayData;
  pcVar2 = (tmp->d).ptr;
  *(undefined4 *)&(tmp->d).d = (undefined4)local_38;
  *(undefined4 *)((long)&(tmp->d).d + 4) = local_38._4_4_;
  *(undefined4 *)&(tmp->d).ptr = (undefined4)uStack_30;
  *(undefined4 *)((long)&(tmp->d).ptr + 4) = uStack_30._4_4_;
  qVar3 = (tmp->d).size;
  (tmp->d).size = local_28;
  local_38 = pQVar1;
  uStack_30 = pcVar2;
  local_28 = qVar3;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return tmp;
  }
  __stack_chk_fail();
}

Assistant:

QString &ProString::toQString(QString &tmp) const
{
    tmp = m_string.mid(m_offset, m_length);
    return tmp;
}